

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_init.c
# Opt level: O0

void luaL_openlibs(lua_State *L)

{
  luaL_Reg *local_18;
  luaL_Reg *lib;
  lua_State *L_local;
  
  for (local_18 = lj_lib_load; local_18->func != (lua_CFunction)0x0; local_18 = local_18 + 1) {
    lua_pushcclosure(L,local_18->func,0);
    lua_pushstring(L,local_18->name);
    lua_call(L,1,0);
  }
  luaL_findtable(L,-10000,"_PRELOAD",1);
  for (local_18 = lj_lib_preload; local_18->func != (lua_CFunction)0x0; local_18 = local_18 + 1) {
    lua_pushcclosure(L,local_18->func,0);
    lua_setfield(L,-2,local_18->name);
  }
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_openlibs(lua_State *L)
{
  const luaL_Reg *lib;
  for (lib = lj_lib_load; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_pushstring(L, lib->name);
    lua_call(L, 1, 0);
  }
  luaL_findtable(L, LUA_REGISTRYINDEX, "_PRELOAD",
		 sizeof(lj_lib_preload)/sizeof(lj_lib_preload[0])-1);
  for (lib = lj_lib_preload; lib->func; lib++) {
    lua_pushcfunction(L, lib->func);
    lua_setfield(L, -2, lib->name);
  }
  lua_pop(L, 1);
}